

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed.c
# Opt level: O0

void sm4_speed(void *p)

{
  undefined8 uVar1;
  undefined8 uVar2;
  SM4_KEY *key;
  int64_t iVar3;
  int64_t iVar4;
  long lVar5;
  long in_RDI;
  double dVar6;
  int i;
  int64_t end_time;
  int64_t start_time;
  uint32_t ticks_hi;
  uint32_t ticks_lo;
  uint32_t start_tick_hi;
  uint32_t start_tick_lo;
  TEST_ARGS *args;
  SM4_KEY *sm4_key;
  double avg_speed_Gb;
  double avg_speed_MB;
  uchar out [16];
  uchar in [16];
  int N;
  double usec;
  int local_90;
  int local_7c;
  uint8_t local_38 [16];
  uint8_t local_28 [20];
  int local_14;
  double local_10;
  long local_8;
  
  local_8 = in_RDI;
  key = (SM4_KEY *)malloc(0x80);
  SM4_set_key(r,0x20,key);
  if (*(long *)(local_8 + 8) * 100 < 0x989681) {
    local_90 = (int)*(undefined8 *)(local_8 + 8) * 100;
  }
  else {
    local_90 = 10000000;
  }
  local_14 = local_90;
  uVar1 = rdtsc();
  iVar3 = gettime_i64();
  for (local_7c = 0; local_7c < local_14; local_7c = local_7c + 1) {
    SM4_encrypt_block(local_28,local_38,key);
  }
  uVar2 = rdtsc();
  iVar4 = gettime_i64();
  local_10 = (double)(iVar4 - iVar3);
  dVar6 = (double)(local_14 << 4) / local_10;
  printf("----------SM4 ENCRYPTION SPEED TEST-----------\n");
  lVar5 = CONCAT44(((int)((ulong)uVar2 >> 0x20) - (int)((ulong)uVar1 >> 0x20)) -
                   (uint)((uint)uVar2 < (uint)uVar1),(uint)uVar2 - (uint)uVar1);
  printf("average cycles per op : %d \n",lVar5 / (long)local_14 & 0xffffffff,lVar5 % (long)local_14)
  ;
  printf("data(MB) \t  time(ms)  \t  speed(MB/s)  \t speed(Gb/s) \n");
  printf("   %d    \t  %.4f  \t    %.4f   \t   %.4f \n\n",local_10 / 1000.0,dVar6,
         (dVar6 * 8.0) / 1000.0,(long)(local_14 << 4) / 1000000 & 0xffffffff,
         (long)(local_14 << 4) % 1000000 & 0xffffffff);
  return;
}

Assistant:

static void sm4_speed(void *p)
{
    double usec;
    int N;
    unsigned char in[16], out[16];
    double avg_speed_MB, avg_speed_Gb;

    SM4_KEY *sm4_key = (SM4_KEY*)malloc(sizeof(SM4_KEY));
    SM4_set_key(r, 32, sm4_key);

    TEST_ARGS *args = (TEST_ARGS*)p;
    N = (args->N * 100) > 10000000 ? 10000000 : (args->N * 100);

    BENCH_VARS;
    COUNTER_START();
    TIMER_START();

    for (int i = 0; i < N; i++)
        SM4_encrypt_block(in, out, sm4_key);

    COUNTER_STOP();
    TIMER_STOP();
    usec = USEC();
    avg_speed_MB = (16 * N) / usec;
    avg_speed_Gb = 8 * avg_speed_MB / 1000;

    printf("----------SM4 ENCRYPTION SPEED TEST-----------\n");
    printf("average cycles per op : %d \n", (int)(TICKS()/N));
    printf("data(MB) \t  time(ms)  \t  speed(MB/s)  \t speed(Gb/s) \n");
    printf("   %d    \t  %.4f  \t    %.4f   \t   %.4f \n\n", 16*N/1000000, usec/1000, avg_speed_MB, avg_speed_Gb);
}